

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

void __thiscall setup::type_entry::load(type_entry *this,istream *is,info *i)

{
  bool bVar1;
  byte bVar2;
  setup_type sVar3;
  uint uVar4;
  logger *plVar5;
  unsigned_long uVar6;
  _Base_bitset<1UL> _Var7;
  enum_type eVar8;
  istream *piVar9;
  enum_type eVar10;
  ostringstream *poVar11;
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> fStack_1b8;
  undefined1 local_1b0 [384];
  
  piVar9 = is;
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags
            ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)local_1b0,(enum_type)is);
  eVar8 = (enum_type)piVar9;
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags(&fStack_1b8,eVar8);
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags
            ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)local_1b0,eVar8);
  local_1b0._8_4_ = i->codepage;
  local_1b0._16_8_ = (bitset<256UL> *)0x0;
  local_1b0._0_8_ = this;
  util::operator>>(is,(encoded_string *)local_1b0);
  local_1b0._0_8_ = &this->description;
  local_1b0._8_4_ = i->codepage;
  local_1b0._16_8_ = (bitset<256UL> *)0x0;
  util::operator>>(is,(encoded_string *)local_1b0);
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    local_1b0._0_8_ = &this->languages;
    local_1b0._8_4_ = i->codepage;
    local_1b0._16_8_ = (bitset<256UL> *)0x0;
    util::operator>>(is,(encoded_string *)local_1b0);
  }
  if ((i->version).value < 0x4000000) {
    bVar1 = version::is_isx(&i->version);
    if ((!bVar1) || ((i->version).value < 0x1031800)) {
      (this->check)._M_string_length = 0;
      *(this->check)._M_dataplus._M_p = '\0';
      goto LAB_0013ad4f;
    }
  }
  local_1b0._0_8_ = &this->check;
  local_1b0._8_4_ = i->codepage;
  local_1b0._16_8_ = (bitset<256UL> *)0x0;
  util::operator>>(is,(encoded_string *)local_1b0);
LAB_0013ad4f:
  piVar9 = is;
  windows_version_range::load(&this->winver,is,&i->version);
  eVar8 = (enum_type)piVar9;
  bVar2 = util::load<unsigned_char,util::little_endian>(is);
  eVar10 = (enum_type)bVar2;
  if ((bVar2 & 1) == 0) {
    _Var7._M_w = (_WordT)(string *)0x0;
  }
  else {
    flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags
              ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)local_1b0,eVar8);
    eVar10 = bVar2 & ~type_flags_End_;
    _Var7._M_w = local_1b0._0_8_;
  }
  if (eVar10 != CustomSetupType) {
    local_1b0._0_4_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
    plVar5 = logger::operator<<((logger *)local_1b0,
                                &enum_names<setup::(anonymous_namespace)::type_flags_Enum_>::name);
    poVar11 = &plVar5->buffer;
    std::operator<<((ostream *)poVar11," flags: ");
    *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar11 + -0x18)) =
         *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar11 + -0x18)) & 0xffffffb5 | 8;
    eVar8 = eVar10;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar11 + -0x18)) =
         *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar11 + -0x18)) & 0xffffffb5 | 2;
    logger::~logger((logger *)local_1b0);
  }
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags
            ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)local_1b0,eVar8);
  this->custom_type = (local_1b0._0_8_ & _Var7._M_w) != 0;
  uVar4 = (i->version).value;
  if (uVar4 < 0x4000300) {
    this->type = User;
  }
  else {
    bVar2 = util::load<unsigned_char,util::little_endian>(is);
    if (bVar2 < 4) {
      sVar3 = *(setup_type *)("[expand 32-byte k" + (ulong)bVar2 * 4 + 0x11);
    }
    else {
      local_1b0._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
      plVar5 = logger::operator<<((logger *)local_1b0,
                                  &enum_names<setup::type_entry::setup_type>::name);
      std::operator<<((ostream *)&plVar5->buffer," value: ");
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar5->buffer);
      logger::~logger((logger *)local_1b0);
      sVar3 = User;
    }
    this->type = sVar3;
    uVar4 = (i->version).value;
  }
  if (uVar4 < 0x4000000) {
    uVar4 = util::load<int,util::little_endian>(is);
    uVar6 = (unsigned_long)uVar4;
  }
  else {
    uVar6 = util::load<long,util::little_endian>(is);
  }
  this->size = uVar6;
  return;
}

Assistant:

void type_entry::load(std::istream & is, const info & i) {
	
	USE_FLAG_NAMES(setup::type_flags)
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	winver.load(is, i.version);
	
	type_flags options = stored_flags<stored_type_flags>(is).get();
	custom_type = ((options & CustomSetupType) != 0);
	
	if(i.version >= INNO_VERSION(4, 0, 3)) {
		type = stored_enum<stored_setup_type>(is).get();
	} else {
		type = User;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		size = util::load<boost::uint64_t>(is);
	} else {
		size = util::load<boost::uint32_t>(is);
	}
}